

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CondEpsGen.h
# Opt level: O3

bool __thiscall
covenant::CondEpsGen<covenant::Sym>::addEpsTrans(CondEpsGen<covenant::Sym> *this,int qi,int qj)

{
  pointer *ppaVar1;
  vector<int,std::allocator<int>> *pvVar2;
  iterator __position;
  iterator iVar3;
  pointer pvVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  pointer piVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int local_38;
  int local_34;
  anon_struct_12_3_f74832de local_30;
  
  local_38 = qj;
  local_34 = qi;
  if (qi < qj) {
    local_30.end = qj;
    local_30.start = qi;
    local_30.s = -1;
    __position._M_current =
         (this->decisions).
         super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->decisions).
        super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
      ::_M_realloc_insert<covenant::CondEpsGen<covenant::Sym>::prod_info>
                (&this->decisions,__position,&local_30);
    }
    else {
      (__position._M_current)->s = -1;
      (__position._M_current)->start = qi;
      (__position._M_current)->end = qj;
      ppaVar1 = &(this->decisions).
                 super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    pvVar2 = (vector<int,std::allocator<int>> *)
             ((this->eps_preds).
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + qj);
    iVar3._M_current = *(int **)(pvVar2 + 8);
    if (iVar3._M_current == *(int **)(pvVar2 + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar2,iVar3,&local_34);
      qi = local_34;
    }
    else {
      *iVar3._M_current = qi;
      *(int **)(pvVar2 + 8) = iVar3._M_current + 1;
    }
    pvVar2 = (vector<int,std::allocator<int>> *)
             ((this->eps_succs).
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + qi);
    iVar3._M_current = *(int **)(pvVar2 + 8);
    if (iVar3._M_current == *(int **)(pvVar2 + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar2,iVar3,&local_38);
    }
    else {
      *iVar3._M_current = qj;
      *(int **)(pvVar2 + 8) = iVar3._M_current + 1;
    }
    iVar6 = this->nprods;
    if (0 < iVar6) {
      iVar11 = 0;
      do {
        lVar10 = (long)iVar11 * (long)this->nstates + (long)local_34;
        pvVar4 = (this->produce_rev).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar8 = pvVar4[lVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar4[lVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data + 8) != piVar8) {
          uVar7 = 0;
          uVar9 = 1;
          do {
            addProd(this,piVar8[uVar7],iVar11,local_38);
            piVar8 = pvVar4[lVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            bVar5 = uVar9 < (ulong)((long)*(pointer *)
                                           ((long)&pvVar4[lVar10].
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data + 8) -
                                    (long)piVar8 >> 2);
            uVar7 = uVar9;
            uVar9 = (ulong)((int)uVar9 + 1);
          } while (bVar5);
          iVar6 = this->nprods;
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < iVar6);
      if (0 < iVar6) {
        iVar11 = 0;
        do {
          lVar10 = (long)iVar11 * (long)this->nstates + (long)local_38;
          pvVar4 = (this->produce_fwd).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar8 = pvVar4[lVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&pvVar4[lVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data + 8) != piVar8) {
            uVar7 = 0;
            uVar9 = 1;
            do {
              addProd(this,local_34,iVar11,piVar8[uVar7]);
              piVar8 = pvVar4[lVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              bVar5 = uVar9 < (ulong)((long)*(pointer *)
                                             ((long)&pvVar4[lVar10].
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data + 8) -
                                      (long)piVar8 >> 2);
              uVar7 = uVar9;
              uVar9 = (ulong)((int)uVar9 + 1);
            } while (bVar5);
            iVar6 = this->nprods;
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 < iVar6);
      }
    }
    bVar5 = update_prods(this);
    return bVar5;
  }
  __assert_fail("qi < qj",
                "/workspace/llm4binary/github/license_all_cmakelists_25/caballa[P]covenant/include/refinement/CondEpsGen.h"
                ,0xcd,
                "bool covenant::CondEpsGen<covenant::Sym>::addEpsTrans(int, int) [EdgeSym = covenant::Sym]"
               );
}

Assistant:

bool addEpsTrans(int qi, int qj)
    {
      assert(qi < qj);
      
      // FIXME: Check that the epsilon transition doesn't
      // already (transitively) exist.

      // Record the decision
      decisions.push_back(mk_prod(qi, EPSSYM, qj));

      // Add it to the set of transitions
      eps_preds[qj].push_back(qi);
      eps_succs[qi].push_back(qj);
      
      // Extend any {qh, A, qi} to {qh, A, qj}
      for(int p = 0; p < nprods; p++)
      {
        vector<int>& rev(prod_rev(qi, p));
        for(unsigned int pi = 0; pi < rev.size(); pi++)
        {
          int qh = rev[pi];
          addProd(qh, p, qj);
        }
      }
      
      // Now extend any {qj, A, qk} to {qi, A, qk}
      for(int p = 0; p < nprods; p++)
      {
        vector<int>& fwd(prod_fwd(qj, p));
        for(unsigned int pi = 0; pi < fwd.size(); pi++)
        {
          int qk = fwd[pi];
          addProd(qi, p, qk); 
        }
      }
      
      return update_prods();
    }